

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

void AlphaVectorPlanning::ExportValueFunction
               (string *filename,ValueFunctionPOMDPDiscrete *V,bool includeBGindices)

{
  char cVar1;
  ostream *poVar2;
  pointer pAVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> values;
  ofstream fp;
  vector<double,_std::allocator<double>_> local_248;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream((ostream *)&local_230,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AlphaVectorPlanning::ExportValueFunction: failed to ",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open file ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x11;
  pAVar3 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_finish != pAVar3) {
    uVar7 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::operator=(&local_248,&pAVar3[uVar7]._m_values);
      uVar6 = (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      if (includeBGindices) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
        std::ostream::_M_insert<long_long>((longlong)&local_230);
      }
      cVar1 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar4 = uVar6 >> 3;
      if ((int)uVar4 != 0) {
        uVar8 = 0;
        do {
          std::ostream::_M_insert<double>
                    (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
          if ((long)uVar8 < (long)(uVar6 * 0x20000000 + -0x100000000) >> 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
          }
          uVar8 = uVar8 + 1;
        } while ((uVar4 & 0xffffffff) != uVar8);
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar5 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      uVar7 = (ulong)((int)uVar7 + 1);
      pAVar3 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (((long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) * -0x3333333333333333 -
             uVar7 != 0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
AlphaVectorPlanning::ExportValueFunction(const string & filename,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         bool includeBGindices)
{
    vector<double> values;

    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ExportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    // floating point precision must be digits10 + 2, to ensure that conversions are correct
    int maxPrecision = numeric_limits<double>::digits10 + 2;
    fp.precision(maxPrecision);

    for(unsigned int i=0;i!=V.size();i++)
    {
        values=V[i].GetValues();
        int nrS=values.size();

        fp << V[i].GetAction();
        // this breaks compatability with Cassandra's software
        if(includeBGindices)
            fp << " " << V[i].GetBetaI();
        fp << endl;

        for(int s=0;s!=nrS;s++)
        {
            fp << values[s];
            if(s<(nrS-1))
                fp << " ";
        }
        fp << endl << endl;
    }
}